

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MNetwork.hpp
# Opt level: O3

void __thiscall
Atari2600::Cartridge::MNetwork::perform_bus_operation
          (MNetwork *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  
  uVar3 = (uint)address;
  uVar2 = uVar3 & 0x1fff;
  if (uVar2 < 0x1000) {
    return;
  }
  if ((ushort)((short)uVar2 + 0xe020U) < 7) {
    puVar4 = (this->super_BusExtender).rom_base_ + ((ulong)(uVar2 << 0xb) - 0xff0000);
    lVar5 = 0x10;
LAB_002e5442:
    *(uint8_t **)((long)this->rom_ptr_ + lVar5 + -0x10) = puVar4;
LAB_002e5446:
    if ((uVar2 >> 0xb & 1) == 0) {
      puVar4 = this->rom_ptr_[0];
      if (puVar4 == (uint8_t *)0x0) {
        if (uVar2 < 0x1400) {
          this->low_ram_[uVar3 & 0x3ff] = *value;
          return;
        }
        if (4 < (int)operation) {
          return;
        }
        uVar1 = this->low_ram_[uVar3 & 0x3ff];
        goto LAB_002e54d1;
      }
      if (4 < (int)operation) {
        return;
      }
      goto LAB_002e54c9;
    }
    if (uVar2 < 0x1900) {
      this->high_ram_ptr_[uVar3 & 0xff] = *value;
      return;
    }
    if (0x19ff < uVar2) goto LAB_002e54c0;
    if (4 < (int)operation) {
      return;
    }
    puVar4 = this->high_ram_ptr_;
    uVar3 = uVar3 & 0xff;
  }
  else {
    if (uVar2 != 0x1fe7) {
      if ((uVar3 & 0x1ffc) == 0x1ff8) {
        puVar4 = this->high_ram_ + (uVar2 * 0x100 - 0x1ff800);
        lVar5 = 0x20;
        goto LAB_002e5442;
      }
      goto LAB_002e5446;
    }
    this->rom_ptr_[0] = (uint8_t *)0x0;
LAB_002e54c0:
    if (4 < (int)operation) {
      return;
    }
    puVar4 = this->rom_ptr_[1];
LAB_002e54c9:
    uVar3 = uVar3 & 0x7ff;
  }
  uVar1 = puVar4[uVar3];
LAB_002e54d1:
  *value = uVar1;
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address >= 0x1fe0 && address <= 0x1fe6) {
				rom_ptr_[0] = rom_base_ + (address - 0x1fe0) * 2048;
			} else if(address == 0x1fe7) {
				rom_ptr_[0] = nullptr;
			} else if(address >= 0x1ff8 && address <= 0x1ffb) {
				int offset = (address - 0x1ff8) * 256;
				high_ram_ptr_ = &high_ram_[offset];
			}

			if(address & 0x800) {
				if(address < 0x1900) {
					high_ram_ptr_[address & 255] = *value;
				} else if(address < 0x1a00) {
					if(isReadOperation(operation)) *value = high_ram_ptr_[address & 255];
				} else {
					if(isReadOperation(operation)) *value = rom_ptr_[1][address & 2047];
				}
			} else {
				if(rom_ptr_[0]) {
					if(isReadOperation(operation)) *value = rom_ptr_[0][address & 2047];
				} else {
					if(address < 0x1400) {
						low_ram_[address & 1023] = *value;
					} else {
						if(isReadOperation(operation)) *value = low_ram_[address & 1023];
					}
				}
			}
		}